

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

Type __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
AddMember<VkResolveModeFlagBits>
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           *this,StringRefType *name,VkResolveModeFlagBits value,
          MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar1;
  ushort uVar2;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> n;
  Data local_28;
  Data local_10;
  
  local_28.s.str = (Ch *)((ulong)name->s | 0x405000000000000);
  local_28.s.hashcode = 0;
  local_28.s.length = name->length;
  local_10.n = (Number)(long)(int)value;
  uVar2 = 0xb6;
  if (-1 < (int)value) {
    uVar2 = 0x1f6;
  }
  local_10.s.str = (Ch *)((ulong)uVar2 << 0x30);
  pGVar1 = AddMember(this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&local_28.s,
                     (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_10.s,allocator);
  return pGVar1;
}

Assistant:

AddMember(StringRefType name, T value, Allocator& allocator) {
        GenericValue n(name);
        return AddMember(n, value, allocator);
    }